

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O3

exr_result_t exr_compress_chunk(exr_encode_pipeline_t *encode)

{
  exr_const_context_t_conflict p_Var1;
  exr_priv_part_t p_Var2;
  void *pvVar3;
  uint64_t uVar4;
  size_t sVar5;
  exr_result_t eVar6;
  size_t sVar7;
  size_t newsz;
  ulong uVar8;
  char *pcVar9;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE_00;
  ulong in_bytes;
  
  if ((encode == (exr_encode_pipeline_t *)0x0) ||
     (p_Var1 = encode->context, p_Var1 == (exr_const_context_t_conflict)0x0)) {
    return 2;
  }
  uVar8 = (ulong)encode->part_index;
  if (((long)uVar8 < 0) || (p_Var1->num_parts <= encode->part_index)) {
    UNRECOVERED_JUMPTABLE_00 = p_Var1->print_error;
    pcVar9 = "Part index (%d) out of range";
    eVar6 = 4;
  }
  else {
    in_bytes = (encode->chunk).unpacked_size;
    if (in_bytes < encode->packed_bytes) {
      in_bytes = encode->packed_bytes;
    }
    p_Var2 = p_Var1->parts[uVar8];
    sVar7 = exr_compress_max_buffer_size(in_bytes);
    eVar6 = internal_encode_alloc_buffer
                      (encode,EXR_TRANSCODE_BUFFER_COMPRESSED,&encode->compressed_buffer,
                       &encode->compressed_alloc_size,sVar7);
    if (eVar6 != 0) {
      UNRECOVERED_JUMPTABLE_00 = p_Var1->print_error;
      sVar7 = exr_compress_max_buffer_size(in_bytes);
      eVar6 = (*UNRECOVERED_JUMPTABLE_00)
                        (p_Var1,eVar6,"error allocating buffer %zu",sVar7,UNRECOVERED_JUMPTABLE_00);
      return eVar6;
    }
    if (encode->sample_count_table != (int32_t *)0x0) {
      sVar7 = (long)(encode->chunk).height * (long)(encode->chunk).width * 4;
      if (p_Var2->comp_type == EXR_COMPRESSION_NONE) {
        internal_encode_free_buffer
                  (encode,EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,&encode->packed_sample_count_table,
                   &encode->packed_sample_count_alloc_size);
        encode->packed_sample_count_table = encode->sample_count_table;
        encode->packed_sample_count_alloc_size = 0;
        encode->packed_sample_count_bytes = sVar7;
      }
      else {
        pvVar3 = encode->packed_buffer;
        uVar4 = encode->packed_bytes;
        sVar5 = encode->packed_alloc_size;
        newsz = exr_compress_max_buffer_size(sVar7);
        eVar6 = internal_encode_alloc_buffer
                          (encode,EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
                           &encode->packed_sample_count_table,
                           &encode->packed_sample_count_alloc_size,newsz);
        if (eVar6 != 0) {
          return eVar6;
        }
        encode->packed_buffer = encode->packed_sample_count_table;
        encode->packed_bytes = sVar7;
        encode->packed_alloc_size = encode->packed_sample_count_alloc_size;
        if (p_Var2->comp_type - EXR_COMPRESSION_ZIPS < 2) {
          eVar6 = internal_exr_apply_zip(encode);
        }
        else {
          if (p_Var2->comp_type != EXR_COMPRESSION_RLE) {
            encode->packed_buffer = pvVar3;
            encode->packed_bytes = uVar4;
            encode->packed_alloc_size = sVar5;
            eVar6 = 3;
            goto LAB_0012d559;
          }
          eVar6 = internal_exr_apply_rle(encode);
        }
        encode->packed_buffer = pvVar3;
        encode->packed_bytes = uVar4;
        encode->packed_alloc_size = sVar5;
        if (eVar6 != 0) {
LAB_0012d559:
          eVar6 = (*p_Var1->print_error)
                            (p_Var1,eVar6,"Unable to compress sample table",p_Var1->print_error);
          return eVar6;
        }
      }
    }
    uVar8 = (ulong)p_Var2->comp_type;
    switch(uVar8) {
    case 0:
      eVar6 = (*p_Var1->report_error)(p_Var1,3,"no compression set but still trying to compress");
      return eVar6;
    case 1:
      eVar6 = internal_exr_apply_rle(encode);
      return eVar6;
    case 2:
    case 3:
      eVar6 = internal_exr_apply_zip(encode);
      return eVar6;
    case 4:
      eVar6 = internal_exr_apply_piz(encode);
      return eVar6;
    case 5:
      eVar6 = internal_exr_apply_pxr24(encode);
      return eVar6;
    case 6:
      eVar6 = internal_exr_apply_b44(encode);
      return eVar6;
    case 7:
      eVar6 = internal_exr_apply_b44a(encode);
      return eVar6;
    case 8:
      eVar6 = internal_exr_apply_dwaa(encode);
      return eVar6;
    case 9:
      eVar6 = internal_exr_apply_dwab(encode);
      return eVar6;
    default:
      UNRECOVERED_JUMPTABLE_00 = p_Var1->print_error;
      pcVar9 = "Compression technique 0x%02X invalid";
      eVar6 = 3;
    }
  }
  eVar6 = (*UNRECOVERED_JUMPTABLE_00)(p_Var1,eVar6,pcVar9,uVar8,UNRECOVERED_JUMPTABLE_00);
  return eVar6;
}

Assistant:

exr_result_t
exr_compress_chunk (exr_encode_pipeline_t* encode)
{
    exr_result_t    rv;
    exr_context_t   ctxt;
    exr_priv_part_t part;
    size_t          maxbytes;

    if (!encode) return EXR_ERR_MISSING_CONTEXT_ARG;
    ctxt = (exr_context_t) encode->context;
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    /* TODO: Double check need for a lock? */
    if (encode->part_index < 0 || encode->part_index >= ctxt->num_parts)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Part index (%d) out of range",
            encode->part_index);

    part = ctxt->parts[encode->part_index];

    maxbytes = encode->chunk.unpacked_size;
    if (encode->packed_bytes > maxbytes)
        maxbytes = encode->packed_bytes;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_COMPRESSED,
        &(encode->compressed_buffer),
        &(encode->compressed_alloc_size),
        exr_compress_max_buffer_size (maxbytes));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "error allocating buffer %zu",
            exr_compress_max_buffer_size (maxbytes));
    //return rv;

    if (encode->sample_count_table)
    {
        uint64_t sampsize =
            (((uint64_t) encode->chunk.width) *
             ((uint64_t) encode->chunk.height));

        sampsize *= sizeof (int32_t);

        if (part->comp_type == EXR_COMPRESSION_NONE)
        {
            internal_encode_free_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
                &(encode->packed_sample_count_table),
                &(encode->packed_sample_count_alloc_size));

            encode->packed_sample_count_table      = encode->sample_count_table;
            encode->packed_sample_count_alloc_size = 0;
            encode->packed_sample_count_bytes = sampsize;
        }
        else
        {
            void *pb;
            size_t pbb, pas;

            pb = encode->packed_buffer;
            pbb = encode->packed_bytes;
            pas = encode->packed_alloc_size;

            rv = internal_encode_alloc_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
                &(encode->packed_sample_count_table),
                &(encode->packed_sample_count_alloc_size),
                exr_compress_max_buffer_size (sampsize));
            if (rv != EXR_ERR_SUCCESS)
                return rv;

            encode->packed_buffer = encode->packed_sample_count_table;
            encode->packed_bytes = sampsize;
            encode->packed_alloc_size = encode->packed_sample_count_alloc_size;
            switch (part->comp_type)
            {
                case EXR_COMPRESSION_NONE: rv = EXR_ERR_INVALID_ARGUMENT; break;
                case EXR_COMPRESSION_RLE: rv = internal_exr_apply_rle (encode); break;
                case EXR_COMPRESSION_ZIP:
                case EXR_COMPRESSION_ZIPS: rv = internal_exr_apply_zip (encode); break;

                default:
                    rv = EXR_ERR_INVALID_ARGUMENT;
                    break;
            }
            encode->packed_buffer = pb;
            encode->packed_bytes = pbb;
            encode->packed_alloc_size = pas;

            if (rv != EXR_ERR_SUCCESS)
                return ctxt->print_error (
                    ctxt,
                    rv,
                    "Unable to compress sample table");
        }
    }

    switch (part->comp_type)
    {
        case EXR_COMPRESSION_NONE:
            return ctxt->report_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "no compression set but still trying to compress");

        case EXR_COMPRESSION_RLE: rv = internal_exr_apply_rle (encode); break;
        case EXR_COMPRESSION_ZIP:
        case EXR_COMPRESSION_ZIPS: rv = internal_exr_apply_zip (encode); break;
        case EXR_COMPRESSION_PIZ: rv = internal_exr_apply_piz (encode); break;
        case EXR_COMPRESSION_PXR24:
            rv = internal_exr_apply_pxr24 (encode);
            break;
        case EXR_COMPRESSION_B44: rv = internal_exr_apply_b44 (encode); break;
        case EXR_COMPRESSION_B44A: rv = internal_exr_apply_b44a (encode); break;
        case EXR_COMPRESSION_DWAA: rv = internal_exr_apply_dwaa (encode); break;
        case EXR_COMPRESSION_DWAB: rv = internal_exr_apply_dwab (encode); break;
        case EXR_COMPRESSION_LAST_TYPE:
        default:
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Compression technique 0x%02X invalid",
                (int) part->comp_type);
    }
    return rv;
}